

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,_1,1>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
               *src,assign_op<double,_double> *func)

{
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType local_90;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_80;
  SrcEvaluatorType local_60;
  
  local_60.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
       (src->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
       m_data;
  local_60.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_outerStride.
  m_value = (src->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
            .m_rows;
  local_60.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_rhsImpl.
  super_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
  .
  super_unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
  .m_arg.m_matrix = (src->m_rhs).m_matrix.m_matrix;
  local_60.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_rhsImpl.
  super_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
  .
  super_unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.
  super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
  m_data = ((local_60.
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_rhsImpl.
             super_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
             .
             super_unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
             .m_arg.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
           m_storage.m_data;
  local_60.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_rhsImpl.
  super_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
  .
  super_unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
  .m_cols.m_value =
       ((local_60.
         super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
         .m_rhsImpl.
         super_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
         .
         super_unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
         .m_arg.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
       .m_rows;
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,_1,1>const>,double,double>
            (dst,src,func);
  local_90.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
  m_data = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_80.m_dst = &local_90;
  local_90.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
  m_outerStride.m_value =
       (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_80.m_src = &local_60;
  local_80.m_functor = func;
  local_80.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_0>
  ::run(&local_80);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}